

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h261.c
# Opt level: O3

int h261_gob(bitstream *str,h261_gob *gob)

{
  int iVar1;
  uint uVar2;
  uint32_t ival;
  uint32_t *puVar3;
  long lVar4;
  ulong uVar5;
  int32_t (*paiVar6) [64];
  uint32_t *val;
  ulong uVar7;
  h261_macroblock *val_00;
  long lVar8;
  uint32_t mba;
  uint32_t gei;
  uint32_t local_64;
  uint32_t local_60;
  uint32_t local_5c;
  uint32_t *local_58;
  ulong local_50;
  int32_t (*local_48) [64];
  h261_macroblock *local_40;
  h261_macroblock *local_38;
  
  iVar1 = vs_u(str,&gob->gquant,5);
  if (iVar1 != 0) {
    return 1;
  }
  local_5c = 0;
  iVar1 = vs_u(str,&local_5c,1);
  if (iVar1 != 0) {
    return 1;
  }
  do {
    if (local_5c == 0) {
      local_60 = gob->gquant;
      local_38 = gob->mbs;
      uVar7 = 0;
      puVar3 = &gob->mbs[0].cbp;
      do {
        local_64 = 0;
        if (str->dir == VS_ENCODE) {
          iVar1 = (int)uVar7;
          if (iVar1 < 0x21) {
            lVar4 = (long)iVar1;
            val = puVar3 + lVar4 * 0x185;
            while (lVar4 = lVar4 + 1, ((h261_macroblock *)(val + -4))->mtype == 0) {
              iVar1 = vs_infer(str,val,0);
              if (iVar1 != 0) {
                return 1;
              }
              local_64 = local_64 + 1;
              uVar7 = (ulong)((int)uVar7 + 1);
              val = val + 0x185;
              if ((int)lVar4 == 0x21) {
                return 0;
              }
            }
          }
          else if (iVar1 == 0x21) {
            return 0;
          }
        }
        local_58 = puVar3;
        while( true ) {
          iVar1 = vs_vlc(str,&local_64,mba_vlc);
          if (iVar1 != 0) {
            return 1;
          }
          iVar1 = (int)uVar7;
          if ((str->dir == VS_ENCODE) || (local_64 < 0x21)) break;
          if (local_64 != 0x21) {
            if (0x20 < iVar1) {
              return 0;
            }
            lVar4 = (long)iVar1;
            puVar3 = &gob->mbs[lVar4].cbp;
            do {
              lVar4 = lVar4 + 1;
              ((h261_macroblock *)(puVar3 + -4))->mtype = 0;
              iVar1 = vs_infer(str,puVar3,0);
              if (iVar1 != 0) {
                return 1;
              }
              puVar3 = puVar3 + 0x185;
            } while ((int)lVar4 != 0x21);
            return 0;
          }
        }
        if (str->dir == VS_DECODE) {
          if (local_64 != 0 && iVar1 < 0x21) {
            puVar3 = local_58 + (long)iVar1 * 0x185;
            uVar5 = (long)iVar1;
            do {
              ((h261_macroblock *)(puVar3 + -4))->mtype = 0;
              iVar1 = vs_infer(str,puVar3,0);
              if (iVar1 != 0) {
                return 1;
              }
              uVar7 = uVar5 + 1;
              local_64 = local_64 - 1;
            } while (((long)uVar5 < 0x20) && (puVar3 = puVar3 + 0x185, uVar5 = uVar7, local_64 != 0)
                    );
          }
          if ((int)uVar7 == 0x21) {
            h261_gob_cold_1();
            return 1;
          }
        }
        val_00 = local_38 + (int)uVar7;
        local_50 = uVar7;
        iVar1 = vs_vlc(str,&val_00->mtype,mtype_vlc);
        if (iVar1 != 0) {
          return 1;
        }
        if ((val_00->mtype & 3) != 0) {
          puVar3 = &val_00->mquant;
          if ((val_00->mtype & 4) == 0) {
            iVar1 = vs_infer(str,puVar3,local_60);
            if (iVar1 != 0) {
              return 1;
            }
          }
          else {
            iVar1 = vs_u(str,puVar3,5);
            if (iVar1 != 0) {
              return 1;
            }
            local_60 = *puVar3;
          }
        }
        uVar2 = val_00->mtype;
        if ((uVar2 & 8) != 0) {
          iVar1 = vs_vlc(str,val_00->mvd,mvd_vlc);
          if (iVar1 != 0) {
            return 1;
          }
          iVar1 = vs_vlc(str,val_00->mvd + 1,mvd_vlc);
          if (iVar1 != 0) {
            return 1;
          }
          uVar2 = val_00->mtype;
        }
        if ((uVar2 & 1) == 0) {
          if ((uVar2 & 2) == 0) {
            ival = 0;
          }
          else {
            ival = 0x3f;
          }
          iVar1 = vs_infer(str,&val_00->cbp,ival);
        }
        else {
          iVar1 = vs_vlc(str,&val_00->cbp,cbp_vlc);
        }
        if (iVar1 != 0) {
          return 1;
        }
        paiVar6 = val_00->block;
        lVar4 = 0;
        local_48 = paiVar6;
        local_40 = val_00;
        do {
          if ((local_40->cbp >> ((uint)lVar4 & 0x1f) & 1) == 0) {
            lVar8 = 0;
            do {
              iVar1 = vs_infers(str,(int32_t *)((long)*paiVar6 + lVar8),0);
              if (iVar1 != 0) {
                return 1;
              }
              lVar8 = lVar8 + 4;
            } while (lVar8 != 0x100);
          }
          else {
            iVar1 = h261_block(str,local_48[lVar4],local_40->mtype & 2);
            if (iVar1 != 0) {
              return 1;
            }
          }
          lVar4 = lVar4 + 1;
          paiVar6 = paiVar6 + 1;
        } while (lVar4 != 6);
        uVar7 = (ulong)((int)local_50 + 1);
        puVar3 = local_58;
      } while( true );
    }
    iVar1 = vs_u(str,&local_5c,8);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_u(str,&local_5c,1);
  } while (iVar1 == 0);
  return 1;
}

Assistant:

int h261_gob(struct bitstream *str, struct h261_gob *gob) {
	if (vs_u(str, &gob->gquant, 5)) return 1;
	uint32_t gei = 0;
	if (vs_u(str, &gei, 1)) return 1;
	while (gei) {
		if (vs_u(str, &gei, 8)) return 1;
		if (vs_u(str, &gei, 1)) return 1;
	}
	int mbi = 0;
	uint32_t quant = gob->gquant;
	while (1) {
		uint32_t mba = 0;
		if (str->dir == VS_ENCODE) {
			while (mbi < H261_GOB_MBS && gob->mbs[mbi].mtype == 0) {
				if (vs_infer(str, &gob->mbs[mbi].cbp, 0)) return 1;
				mbi++, mba++;
			}
		       	if (mbi == H261_GOB_MBS)
				return 0;
		}
		while (1) {
			if (vs_vlc(str, &mba, mba_vlc)) return 1;
			if (str->dir == VS_ENCODE || mba < 33)
				break;
			if (mba == 33) /* stuffing */
				continue;
			/* end */
			while (mbi < H261_GOB_MBS) {
				gob->mbs[mbi].mtype = 0;
				if (vs_infer(str, &gob->mbs[mbi].cbp, 0)) return 1;
				mbi++;
			}
			return 0;
		}
		if (str->dir == VS_DECODE) {
			while (mbi < H261_GOB_MBS && mba) {
				gob->mbs[mbi].mtype = 0;
				if (vs_infer(str, &gob->mbs[mbi].cbp, 0)) return 1;
				mbi++, mba--;
			}
			if (mbi == H261_GOB_MBS) {
				fprintf(stderr, "Macroblock address overrun\n");
				return 1;
			}
		}
		struct h261_macroblock *mb = &gob->mbs[mbi];
		if (vs_vlc(str, &mb->mtype, mtype_vlc)) return 1;
		if (mb->mtype & (H261_MTYPE_FLAG_CODED | H261_MTYPE_FLAG_INTRA)) {
			if (mb->mtype & H261_MTYPE_FLAG_QUANT) {
				if (vs_u(str, &mb->mquant, 5)) return 1;
				quant = mb->mquant;
			} else {
				if (vs_infer(str, &mb->mquant, quant)) return 1;
			}
		}
		if (mb->mtype & H261_MTYPE_FLAG_MC) {
			if (vs_vlc(str, &mb->mvd[0], mvd_vlc)) return 1;
			if (vs_vlc(str, &mb->mvd[1], mvd_vlc)) return 1;
		}
		if (mb->mtype & H261_MTYPE_FLAG_CODED) {
			if (vs_vlc(str, &mb->cbp, cbp_vlc)) return 1;
		} else if (mb->mtype & H261_MTYPE_FLAG_INTRA) {
			if (vs_infer(str, &mb->cbp, 0x3f)) return 1;
		} else {
			if (vs_infer(str, &mb->cbp, 0)) return 1;
		}
		int j, k;
		for (j = 0; j < 6; j++) {
			if (mb->cbp & (1 << j)) {
				if (h261_block(str, mb->block[j], mb->mtype & H261_MTYPE_FLAG_INTRA)) return 1;
			} else {
				for (k = 0; k < 64; k++)
					if (vs_infers(str, &mb->block[j][k], 0)) return 1;
			}
		}
		mbi++;
	}
	return 0;
}